

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_parser.cpp
# Opt level: O0

int __thiscall
coda_url::create_suburl(coda_url *this,char *u,size_t sz,uint32_t flags,coda_url *parent)

{
  char *pcVar1;
  size_t len;
  size_t in_RDX;
  char *in_RSI;
  coda_url *in_RDI;
  long *in_R8;
  char *p;
  size_t sz_pub;
  size_t sz_dom;
  char *local_40;
  coda_url *this_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar2;
  
  this_00 = in_RDI;
  pcVar1 = coda_strxstr((char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                        (char *)in_RDI,(size_t)in_RSI);
  if (pcVar1 == (char *)0x0) {
    pcVar1 = coda_strxstr((char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                          (char *)this_00,(size_t)in_RSI);
    if (pcVar1 == (char *)0x0) {
      if (*in_RSI == '#') {
        iVar2 = -1;
      }
      else {
        iVar2 = 8;
        if (*(char *)(*in_R8 + 4) != 's') {
          iVar2 = 7;
        }
        local_40 = coda_strnchr((char *)(*in_R8 + (long)iVar2),'/',
                                (ulong)*(uint *)(in_R8 + 1) - (long)iVar2);
        local_40 = local_40 + -*in_R8;
        pcVar1 = coda_strnchr(in_RSI,'#',in_RDX);
        if (pcVar1 != (char *)0x0) {
          in_RDX = (long)pcVar1 - (long)in_RSI;
        }
        if (*in_RSI != '/') {
          len = coda_strnchp((char *)*in_R8,'?',(ulong)*(uint *)(in_R8 + 1));
          local_40 = coda_revnchr((char *)*in_R8,'/',len);
          local_40 = local_40 + (1 - *in_R8);
        }
        memcpy(in_RDI->val_str,(void *)*in_R8,(size_t)local_40);
        memcpy(in_RDI->val_str + (long)local_40,in_RSI,in_RDX);
        in_RDI->val_len = (int)local_40 + (int)in_RDX;
        in_RDI->dom_len = *(uint32_t *)(in_R8 + 3);
        in_RDI->dom_str = (char *)in_R8[2];
        iVar2 = assign_refers(this_00,in_RSI,(uint32_t)(in_RDX >> 0x20));
      }
    }
    else {
      iVar2 = -1;
    }
  }
  else {
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int coda_url::create_suburl(const char *u, size_t sz, uint32_t flags, const coda_url &parent)
{
	if (NULL != coda_strxstr(u, "mailto:", 7)) return -1;
	if (NULL != coda_strxstr(u, "javascript:", 11)) return -1;
	if ( '#' == *u) return -1;

	size_t sz_dom = (parent.val_str[4] != 's' ? 7 : 8);
	size_t sz_pub = sz_dom = coda_strnchr(parent.val_str + sz_dom,
		'/', parent.val_len - sz_dom) - parent.val_str;

	char *p = coda_strnchr(u, '#', sz);
	if (NULL != p) sz = p - u;

	if ('/' != *u)
	{
		sz_pub = coda_strnchp(parent.val_str, '?', parent.val_len);
		sz_pub = coda_revnchr(parent.val_str, '/', sz_pub) - parent.val_str + 1;
	}

	val_len = coda_cpymsz(val_str, parent.val_str, sz_pub)
			+ coda_cpymsz(val_str + sz_pub, u, sz);

	dom_len = parent.dom_len;
	dom_str = parent.dom_str;

	return assign_refers(val_str + sz_dom, flags);
}